

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP5Writer::FlushProfiler(BP5Writer *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  string *toFileName;
  FileDrainer *this_00;
  FileFStream *this_01;
  size_t in_RDI;
  string *this_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bpBaseNames;
  FileFStream profilingJSONStream;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bpTargetNames;
  string profileFileName;
  vector<char,_std::allocator<char>_> profilingJSON;
  string lineJSON;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  transportProfilersMD;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transportTypesMD;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  transportProfilers;
  size_t i;
  int fileTransportIdx;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transportTypes;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  *in_stack_fffffffffffff958;
  vector<char,_std::allocator<char>_> *pvVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff968;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  *in_stack_fffffffffffff970;
  char *in_stack_fffffffffffff980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff988;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff990;
  iterator in_stack_fffffffffffff998;
  string *psVar5;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  *in_stack_fffffffffffff9a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff9a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff9b0;
  const_iterator in_stack_fffffffffffff9b8;
  Comm *in_stack_fffffffffffff9c8;
  FileFStream *in_stack_fffffffffffff9d0;
  TransportMan *in_stack_fffffffffffff9d8;
  string *local_600;
  FileFStream *this_03;
  size_type start;
  char *in_stack_fffffffffffffa68;
  FileFStream *in_stack_fffffffffffffa70;
  string local_578 [8];
  string *in_stack_fffffffffffffa90;
  JSONProfiler *in_stack_fffffffffffffa98;
  string local_548 [32];
  string *local_528;
  undefined8 local_520;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_518 [6];
  undefined1 in_stack_fffffffffffffb82;
  undefined1 in_stack_fffffffffffffb83;
  Mode in_stack_fffffffffffffb84;
  string *in_stack_fffffffffffffb88;
  FileFStream *in_stack_fffffffffffffb90;
  string local_1e8 [32];
  string local_1c8 [40];
  string *local_1a0;
  string local_198 [32];
  string *local_178;
  undefined8 local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  string local_150 [32];
  vector<char,_std::allocator<char>_> local_130;
  string local_118 [32];
  string local_f8 [32];
  IOChrono **local_d8;
  IOChrono **local_d0;
  IOChrono **local_c8;
  IOChrono **local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  undefined1 local_58 [16];
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  size_type local_30;
  int local_24;
  
  transportman::TransportMan::GetTransportsTypes_abi_cxx11_(in_stack_fffffffffffff9d8);
  local_24 = -1;
  local_30 = 0;
  while( true ) {
    start = local_30;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xffffffffffffffe0);
    if (sVar2 <= start) break;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&stack0xffffffffffffffe0,local_30);
    iVar1 = std::__cxx11::string::compare((ulong)pvVar3,0,(char *)0x4);
    if (iVar1 == 0) {
      local_24 = (int)local_30;
    }
    local_30 = local_30 + 1;
  }
  transportman::TransportMan::GetTransportsProfilers
            ((TransportMan *)in_stack_fffffffffffff9a8._M_current);
  transportman::TransportMan::GetTransportsTypes_abi_cxx11_(in_stack_fffffffffffff9d8);
  transportman::TransportMan::GetTransportsProfilers
            ((TransportMan *)in_stack_fffffffffffff9a8._M_current);
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff958);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            (in_stack_fffffffffffff960,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff958);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff958);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff958);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
             insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                       ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff9b8,
                        in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  this_03 = (FileFStream *)local_58;
  local_c0 = (IOChrono **)
             std::
             vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>::
             end(in_stack_fffffffffffff958);
  __gnu_cxx::
  __normal_iterator<adios2::profiling::IOChrono*const*,std::vector<adios2::profiling::IOChrono*,std::allocator<adios2::profiling::IOChrono*>>>
  ::__normal_iterator<adios2::profiling::IOChrono**>
            ((__normal_iterator<adios2::profiling::IOChrono_*const_*,_std::vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>_>
              *)in_stack_fffffffffffff960,
             (__normal_iterator<adios2::profiling::IOChrono_**,_std::vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>_>
              *)in_stack_fffffffffffff958);
  local_c8 = (IOChrono **)
             std::
             vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>::
             begin(in_stack_fffffffffffff958);
  local_d0 = (IOChrono **)
             std::
             vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>::
             end(in_stack_fffffffffffff958);
  local_d8 = (IOChrono **)
             std::vector<adios2::profiling::IOChrono*,std::allocator<adios2::profiling::IOChrono*>>
             ::
             insert<__gnu_cxx::__normal_iterator<adios2::profiling::IOChrono**,std::vector<adios2::profiling::IOChrono*,std::allocator<adios2::profiling::IOChrono*>>>,void>
                       (in_stack_fffffffffffff9a0,
                        (const_iterator)in_stack_fffffffffffff9b8._M_current,
                        (__normal_iterator<adios2::profiling::IOChrono_**,_std::vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>_>
                         )in_stack_fffffffffffff9b0._M_current,
                        (__normal_iterator<adios2::profiling::IOChrono_**,_std::vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>_>
                         )in_stack_fffffffffffff9a8._M_current);
  profiling::JSONProfiler::GetRankProfilingJSON
            ((JSONProfiler *)in_stack_ffffffffffffffc8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::operator+(in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960);
  std::__cxx11::string::~string(local_118);
  profiling::JSONProfiler::AggregateProfilingJSON
            (in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  if (*(int *)(in_RDI + 0xc0) == 0) {
    std::__cxx11::string::string(local_150);
    if ((*(byte *)(in_RDI + 0x7ca) & 1) == 0) {
      adios2::transport::FileFStream::FileFStream
                (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      std::__cxx11::string::string(local_548,(string *)(in_RDI + 0x30));
      local_528 = local_548;
      local_520 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0xa902a6);
      __l_00._M_len = (size_type)in_stack_fffffffffffff9a0;
      __l_00._M_array = in_stack_fffffffffffff998;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffff990,__l_00,(allocator_type *)in_stack_fffffffffffff988);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0xa902d7);
      psVar5 = local_548;
      this_02 = (string *)&local_528;
      do {
        this_02 = this_02 + -0x20;
        std::__cxx11::string::~string(this_02);
      } while (this_02 != psVar5);
      if (local_24 < 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_518,0);
        std::operator+(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
        std::__cxx11::string::operator=(local_150,(string *)&stack0xfffffffffffffa68);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffa68);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_518,(long)local_24);
        std::operator+(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
        std::__cxx11::string::operator=(local_150,local_578);
        std::__cxx11::string::~string(local_578);
      }
      adios2::transport::FileFStream::Open
                (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb84,
                 (bool)in_stack_fffffffffffffb83,(bool)in_stack_fffffffffffffb82);
      pvVar4 = &local_130;
      this_01 = (FileFStream *)
                std::vector<char,_std::allocator<char>_>::data
                          ((vector<char,_std::allocator<char>_> *)0xa904f5);
      std::vector<char,_std::allocator<char>_>::size(pvVar4);
      adios2::transport::FileFStream::Write
                (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_RDI,start);
      adios2::transport::FileFStream::Close(this_03);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff970);
      adios2::transport::FileFStream::~FileFStream(this_01);
    }
    else {
      local_1a0 = local_198;
      std::__cxx11::string::string(local_1a0,(string *)(in_RDI + 0x30));
      local_178 = local_198;
      local_170 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0xa8ff4d);
      __l._M_len = (size_type)in_stack_fffffffffffff9a0;
      __l._M_array = in_stack_fffffffffffff998;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffff990,__l,(allocator_type *)in_stack_fffffffffffff988);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0xa8ff81);
      local_600 = (string *)&local_178;
      do {
        local_600 = local_600 + -0x20;
        std::__cxx11::string::~string(local_600);
      } while (local_600 != local_198);
      if (local_24 < 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_168,0);
        std::operator+(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
        std::__cxx11::string::operator=(local_150,local_1e8);
        std::__cxx11::string::~string(local_1e8);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_168,(long)local_24);
        std::operator+(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
        std::__cxx11::string::operator=(local_150,local_1c8);
        std::__cxx11::string::~string(local_1c8);
      }
      toFileName = (string *)(in_RDI + 2000);
      pvVar4 = &local_130;
      this_00 = (FileDrainer *)std::vector<char,_std::allocator<char>_>::size(pvVar4);
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0xa9020c);
      burstbuffer::FileDrainer::AddOperationWrite
                (this_00,toFileName,(size_t)pvVar4,in_stack_fffffffffffff9a8._M_current);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff970);
    }
    std::__cxx11::string::~string(local_150);
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff970);
  std::__cxx11::string::~string(local_f8);
  std::vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>::
  ~vector(in_stack_fffffffffffff970);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff970);
  std::vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>::
  ~vector(in_stack_fffffffffffff970);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff970);
  return;
}

Assistant:

void BP5Writer::FlushProfiler()
{
    auto transportTypes = m_FileDataManager.GetTransportsTypes();

    // find first File type output, where we can write the profile
    int fileTransportIdx = -1;
    for (size_t i = 0; i < transportTypes.size(); ++i)
    {
        if (transportTypes[i].compare(0, 4, "File") == 0)
        {
            fileTransportIdx = static_cast<int>(i);
        }
    }

    auto transportProfilers = m_FileDataManager.GetTransportsProfilers();

    auto transportTypesMD = m_FileMetadataManager.GetTransportsTypes();
    auto transportProfilersMD = m_FileMetadataManager.GetTransportsProfilers();

    transportTypes.insert(transportTypes.end(), transportTypesMD.begin(), transportTypesMD.end());

    transportProfilers.insert(transportProfilers.end(), transportProfilersMD.begin(),
                              transportProfilersMD.end());

    // m_Profiler.WriteOut(transportTypes, transportProfilers);

    const std::string lineJSON(m_Profiler.GetRankProfilingJSON(transportTypes, transportProfilers) +
                               ",\n");

    const std::vector<char> profilingJSON(m_Profiler.AggregateProfilingJSON(lineJSON));

    if (m_RankMPI == 0)
    {
        // std::cout << "write profiling file!" << std::endl;
        std::string profileFileName;
        if (m_DrainBB)
        {
            // auto bpTargetNames =
            // m_BP4Serializer.GetBPBaseNames({m_Name});
            std::vector<std::string> bpTargetNames = {m_Name};
            if (fileTransportIdx > -1)
            {
                profileFileName = bpTargetNames[fileTransportIdx] + "/profiling.json";
            }
            else
            {
                profileFileName = bpTargetNames[0] + "_profiling.json";
            }
            m_FileDrainer.AddOperationWrite(profileFileName, profilingJSON.size(),
                                            profilingJSON.data());
        }
        else
        {
            transport::FileFStream profilingJSONStream(m_Comm);
            // auto bpBaseNames =
            // m_BP4Serializer.GetBPBaseNames({m_BBName});
            std::vector<std::string> bpBaseNames = {m_Name};
            if (fileTransportIdx > -1)
            {
                profileFileName = bpBaseNames[fileTransportIdx] + "/profiling.json";
            }
            else
            {
                profileFileName = bpBaseNames[0] + "_profiling.json";
            }
            profilingJSONStream.Open(profileFileName, Mode::Write);
            profilingJSONStream.Write(profilingJSON.data(), profilingJSON.size());
            profilingJSONStream.Close();
        }
    }
}